

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__sort_chunks(stb__alloc *src)

{
  long *plVar1;
  long *plVar2;
  stb__chunk *d;
  stb__chunk *c;
  stb__alloc *src_local;
  
  plVar2 = (long *)((long)&src->chunks[-1].alloc + 2);
  if (((plVar2 != (long *)0x0) && (plVar1 = (long *)*plVar2, plVar1 != (long *)0x0)) &&
     (*(int *)((long)&src->chunks->next + 6) <= *(int *)(plVar1 + 1))) {
    *plVar2 = *plVar1;
    *plVar1 = (long)plVar2;
    src->chunks = (stb__chunk *)((long)plVar1 + 2);
  }
  return;
}

Assistant:

static void stb__sort_chunks(stb__alloc *src)
{
   // of the first two chunks, put the chunk with more data left in it first
   stb__chunk *c = stb__chunks(src), *d;
   if (c == NULL) return;
   d = c->next;
   if (d == NULL) return;
   if (c->data_left > d->data_left) return;

   c->next = d->next;
   d->next = c;
   stb__setchunks(src, d);
}